

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest> *this,
          void *pointer)

{
  if (pointer != (void *)0x0) {
    capnp::BuilderCapabilityTable::~BuilderCapabilityTable
              ((BuilderCapabilityTable *)((long)pointer + 0x38));
    Own<capnp::OutgoingRpcMessage>::dispose
              ((Own<capnp::OutgoingRpcMessage> *)((long)pointer + 0x28));
    Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcClient>::~Own
              ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcClient> *)
               ((long)pointer + 0x18));
    Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::~Own
              ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)((long)pointer + 8));
  }
  operator_delete(pointer,0xa0);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }